

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfileMemory.cpp
# Opt level: O1

void MemoryProfiler::PrintAll(void)

{
  BasePtr<MemoryProfiler> this;
  
  Output::Print(
               L"========================================================================================================\n"
               );
  Output::Print(L"Memory Profile (All threads)\n");
  for (this = profilers.super_BasePtr<MemoryProfiler>.ptr; this.ptr != (MemoryProfiler *)0x0;
      this.ptr = (this.ptr)->next) {
    Print(this.ptr);
  }
  Output::Flush();
  return;
}

Assistant:

void
MemoryProfiler::PrintAll()
{
    Output::Print(_u("========================================================================================================\n"));
    Output::Print(_u("Memory Profile (All threads)\n"));

    ForEachProfiler([] (MemoryProfiler * memoryProfiler)
    {
        memoryProfiler->Print();
    });

    Output::Flush();
}